

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldump.c
# Opt level: O1

void dumpFunction(DumpState *D,Proto *f)

{
  TValue *pTVar1;
  int iVar2;
  ulong in_RAX;
  uint uVar3;
  size_t sVar4;
  TString *ts;
  byte bVar5;
  size_t sVar6;
  long lVar7;
  lu_byte x;
  ulong local_38;
  
  local_38 = in_RAX;
  dumpVarint(D,(long)f->linedefined);
  dumpVarint(D,(long)f->lastlinedefined);
  if (D->status == 0) {
    local_38._0_1_ = f->numparams;
    iVar2 = (*D->writer)(D->L,&local_38,1,D->data);
    D->status = iVar2;
    D->offset = D->offset + 1;
  }
  local_38._0_1_ = f->flag;
  if (D->status == 0) {
    iVar2 = (*D->writer)(D->L,&local_38,1,D->data);
    D->status = iVar2;
    D->offset = D->offset + 1;
  }
  local_38 = CONCAT71(local_38._1_7_,f->maxstacksize);
  if (D->status == 0) {
    iVar2 = (*D->writer)(D->L,&local_38,1,D->data);
    D->status = iVar2;
    D->offset = D->offset + 1;
  }
  sVar4 = (size_t)f->sizecode;
  dumpVarint(D,sVar4);
  dumpAlign(D,(uint)sVar4);
  if (D->status == 0) {
    sVar4 = (ulong)(uint)f->sizecode * 4;
    iVar2 = (*D->writer)(D->L,f->code,sVar4,D->data);
    D->status = iVar2;
    D->offset = D->offset + sVar4;
  }
  sVar4 = (size_t)f->sizek;
  dumpVarint(D,sVar4);
  if (0 < (long)sVar4) {
    lVar7 = 0;
    do {
      pTVar1 = f->k;
      bVar5 = (&pTVar1->tt_)[lVar7] & 0x3f;
      local_38 = CONCAT71(local_38._1_7_,(&pTVar1->tt_)[lVar7]) & 0xffffffffffffff3f;
      if (D->status == 0) {
        iVar2 = (*D->writer)(D->L,&local_38,1,D->data);
        D->status = iVar2;
        D->offset = D->offset + 1;
      }
      if (bVar5 < 0x13) {
        if (bVar5 == 3) {
          local_38 = *(ulong *)((long)&pTVar1->value_ + lVar7);
LAB_0010cb9c:
          if (D->status == 0) {
            iVar2 = (*D->writer)(D->L,&local_38,8,D->data);
            D->status = iVar2;
            D->offset = D->offset + 8;
          }
        }
        else if (bVar5 == 4) goto LAB_0010cb84;
      }
      else {
        if (bVar5 != 0x14) {
          if (bVar5 != 0x13) goto LAB_0010cbbf;
          local_38 = *(ulong *)((long)&pTVar1->value_ + lVar7);
          goto LAB_0010cb9c;
        }
LAB_0010cb84:
        dumpString(D,*(TString **)((long)&pTVar1->value_ + lVar7));
      }
LAB_0010cbbf:
      lVar7 = lVar7 + 0x10;
    } while (sVar4 * 0x10 != lVar7);
  }
  sVar4 = (size_t)f->sizeupvalues;
  dumpVarint(D,sVar4);
  if (0 < (long)sVar4) {
    lVar7 = 0;
    do {
      if (D->status == 0) {
        local_38._0_1_ = (&f->upvalues->instack)[lVar7];
        iVar2 = (*D->writer)(D->L,&local_38,1,D->data);
        D->status = iVar2;
        D->offset = D->offset + 1;
      }
      local_38._0_1_ = (&f->upvalues->idx)[lVar7];
      if (D->status == 0) {
        iVar2 = (*D->writer)(D->L,&local_38,1,D->data);
        D->status = iVar2;
        D->offset = D->offset + 1;
      }
      local_38 = CONCAT71(local_38._1_7_,(&f->upvalues->kind)[lVar7]);
      if (D->status == 0) {
        iVar2 = (*D->writer)(D->L,&local_38,1,D->data);
        D->status = iVar2;
        D->offset = D->offset + 1;
      }
      lVar7 = lVar7 + 0x10;
    } while (sVar4 * 0x10 != lVar7);
  }
  sVar4 = (size_t)f->sizep;
  dumpVarint(D,sVar4);
  if (0 < (long)sVar4) {
    sVar6 = 0;
    do {
      dumpFunction(D,f->p[sVar6]);
      sVar6 = sVar6 + 1;
    } while (sVar4 != sVar6);
  }
  uVar3 = 0;
  if (D->strip == 0) {
    ts = f->source;
  }
  else {
    ts = (TString *)0x0;
  }
  dumpString(D,ts);
  if (D->strip == 0) {
    uVar3 = f->sizelineinfo;
  }
  dumpVarint(D,(long)(int)uVar3);
  if ((f->lineinfo != (ls_byte *)0x0) && (D->status == 0)) {
    iVar2 = (*D->writer)(D->L,f->lineinfo,(ulong)uVar3,D->data);
    D->status = iVar2;
    D->offset = D->offset + (ulong)uVar3;
  }
  uVar3 = 0;
  if (D->strip == 0) {
    uVar3 = f->sizeabslineinfo;
  }
  sVar4 = (size_t)(int)uVar3;
  dumpVarint(D,sVar4);
  if ((0 < (int)uVar3) && (dumpAlign(D,(uint)sVar4), D->status == 0)) {
    iVar2 = (*D->writer)(D->L,f->abslineinfo,(ulong)uVar3 * 8,D->data);
    D->status = iVar2;
    D->offset = D->offset + (ulong)uVar3 * 8;
  }
  uVar3 = 0;
  if (D->strip == 0) {
    uVar3 = f->sizelocvars;
  }
  dumpVarint(D,(long)(int)uVar3);
  if (0 < (int)uVar3) {
    lVar7 = 0;
    do {
      dumpString(D,*(TString **)((long)&f->locvars->varname + lVar7));
      dumpVarint(D,(long)*(int *)((long)&f->locvars->startpc + lVar7));
      dumpVarint(D,(long)*(int *)((long)&f->locvars->endpc + lVar7));
      lVar7 = lVar7 + 0x10;
    } while ((ulong)uVar3 << 4 != lVar7);
  }
  uVar3 = 0;
  if (D->strip == 0) {
    uVar3 = f->sizeupvalues;
  }
  dumpVarint(D,(long)(int)uVar3);
  if (0 < (int)uVar3) {
    lVar7 = 0;
    do {
      dumpString(D,*(TString **)((long)&f->upvalues->name + lVar7));
      lVar7 = lVar7 + 0x10;
    } while ((ulong)uVar3 << 4 != lVar7);
  }
  return;
}

Assistant:

static void dumpFunction (DumpState *D, const Proto *f) {
  dumpInt(D, f->linedefined);
  dumpInt(D, f->lastlinedefined);
  dumpByte(D, f->numparams);
  dumpByte(D, f->flag);
  dumpByte(D, f->maxstacksize);
  dumpCode(D, f);
  dumpConstants(D, f);
  dumpUpvalues(D, f);
  dumpProtos(D, f);
  dumpString(D, D->strip ? NULL : f->source);
  dumpDebug(D, f);
}